

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O1

OLECHAR __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::PeekNextChar(Scanner<UTF8EncodingPolicyBase<false>_> *this)

{
  OLECHAR OVar1;
  byte *local_10;
  
  local_10 = this->m_currentCharacter;
  if (local_10 < this->m_pchLast) {
    OVar1 = (OLECHAR)*local_10;
  }
  else {
    OVar1 = L'\0';
  }
  if (0x7f < (ushort)OVar1) {
    OVar1 = UTF8EncodingPolicyBase<false>::ReadFull<false>
                      (&this->super_UTF8EncodingPolicyBase<false>,&local_10,this->m_pchLast);
  }
  return OVar1;
}

Assistant:

OLECHAR PeekNextChar(void)
    {
        return this->PeekFull(m_currentCharacter, m_pchLast);
    }